

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O3

void __thiscall deqp::egl::anon_unknown_0::ThreadCleanUpTest::deinit(ThreadCleanUpTest *this)

{
  Library *pLVar1;
  
  pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  if (this->m_surface != (EGLSurface)0x0) {
    (*pLVar1->_vptr_Library[0x16])(pLVar1,this->m_display);
    this->m_surface = (EGLSurface)0x0;
  }
  if (this->m_context != (EGLContext)0x0) {
    (*pLVar1->_vptr_Library[0x13])(pLVar1,this->m_display);
    this->m_context = (EGLContext)0x0;
  }
  if (this->m_display != (EGLDisplay)0x0) {
    (*pLVar1->_vptr_Library[0x34])(pLVar1);
    this->m_display = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void deinit (void)
	{
		const Library& egl = m_eglTestCtx.getLibrary();

		if (m_surface != EGL_NO_SURFACE)
		{
			egl.destroySurface(m_display, m_surface);
			m_surface = EGL_NO_SURFACE;
		}

		if (m_context != EGL_NO_CONTEXT)
		{
			egl.destroyContext(m_display, m_context);
			m_context = EGL_NO_CONTEXT;
		}

		if (m_display != EGL_NO_DISPLAY)
		{
			egl.terminate(m_display);
			m_display = EGL_NO_DISPLAY;
		}
	}